

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

int __thiscall
google::protobuf::Reflection::FieldSize(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  RepeatedField<int> *pRVar3;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar4;
  LogMessage *other;
  FieldDescriptor *local_58;
  code *local_50 [7];
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"FieldSize","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"FieldSize",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x42] != (FieldDescriptor)0x1) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_50[0] = FieldDescriptor::TypeOnceInit;
      local_58 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),local_50,&local_58);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
    case 8:
      pRVar3 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      break;
    case 2:
      pRVar3 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      break;
    case 3:
      pRVar3 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      break;
    case 4:
      pRVar3 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      break;
    case 5:
      pRVar3 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      break;
    case 6:
      pRVar3 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      break;
    case 7:
      pRVar3 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      break;
    case 9:
    case 10:
      bVar1 = anon_unknown_0::IsMapFieldInApi(field);
      if (bVar1) {
        this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        bVar1 = internal::MapFieldBase::IsRepeatedFieldValid(this_00);
        if (!bVar1) {
          iVar2 = (*this_00->_vptr_MapFieldBase[10])(this_00);
          return iVar2;
        }
        pRVar4 = internal::MapFieldBase::GetRepeatedField(this_00);
      }
      else {
        pRVar4 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      }
      return pRVar4->current_size_;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_50,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x310);
      other = internal::LogMessage::operator<<((LogMessage *)local_50,"Can\'t get here.");
      internal::LogFinisher::operator=((LogFinisher *)&local_58,other);
      internal::LogMessage::~LogMessage((LogMessage *)local_50);
      return 0;
    }
    return pRVar3->current_size_;
  }
  iVar2 = internal::ExtensionSet::ExtensionSize
                    ((ExtensionSet *)
                     ((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44));
  return iVar2;
}

Assistant:

int Reflection::FieldSize(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)    \
  case FieldDescriptor::CPPTYPE_##UPPERCASE: \
    return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          const internal::MapFieldBase& map =
              GetRaw<MapFieldBase>(message, field);
          if (map.IsRepeatedFieldValid()) {
            return map.GetRepeatedField().size();
          } else {
            // No need to materialize the repeated field if it is out of sync:
            // its size will be the same as the map's size.
            return map.size();
          }
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}